

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[39],kj::String,char_const(&)[9],kj::String,kj::String,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [39],String *params_1,
          char (*params_2) [9],String *params_3,String *params_4,char *params_5)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  FixedArray<char,_1UL> *in_stack_ffffffffffffff70;
  undefined1 local_81 [9];
  char *local_78;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  kj *local_50;
  size_t local_48;
  ArrayPtr<const_char> local_40;
  
  local_48 = strlen((char *)this);
  pcVar1 = *(char **)(*params + 8);
  local_60.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_60.ptr = *(char **)*params;
  }
  pcVar3 = (char *)0x0;
  local_60.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_60.size_ = (size_t)pcVar3;
  }
  local_50 = this;
  local_70.size_ = strlen((char *)params_1);
  lVar2 = *(long *)(*params_2 + 8);
  local_81._1_8_ = lVar2;
  if (lVar2 != 0) {
    local_81._1_8_ = *(undefined8 *)*params_2;
  }
  local_78 = (char *)(lVar2 + -1);
  if (lVar2 == 0) {
    local_78 = pcVar3;
  }
  pcVar1 = (char *)(params_3->content).size_;
  local_40.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_40.ptr = (params_3->content).ptr;
  }
  local_40.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_40.size_ = (size_t)pcVar3;
  }
  local_81[0] = *(undefined1 *)&(params_4->content).ptr;
  local_70.ptr = (char *)params_1;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)(local_81 + 1),&local_40,(ArrayPtr<const_char> *)local_81,
             in_stack_ffffffffffffff70);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}